

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

csubstr __thiscall
c4::yml::Parser::_filter_block_scalar
          (Parser *this,substr s,BlockStyle_e style,BlockChomp_e chomp,size_t indentation)

{
  size_t l;
  size_t b;
  substr buf;
  substr buf_00;
  substr dst;
  substr dst_00;
  csubstr fmt;
  bool bVar1;
  error_flags eVar2;
  int in_ECX;
  size_t in_RDX;
  char *in_RSI;
  ulong uVar3;
  long in_RDI;
  int in_R8D;
  ulong in_R9;
  ro_substr rVar4;
  csubstr cVar5;
  bool changed_1;
  char msg_15 [42];
  char msg_14 [47];
  size_t j_2;
  size_t j_1;
  char msg_13 [48];
  char msg_12 [54];
  size_t this_indentation;
  size_t last_newl;
  char msg_11 [46];
  size_t j;
  char msg_10 [29];
  char msg_9 [29];
  char msg_8 [29];
  char msg_7 [34];
  char msg_6 [32];
  size_t first_1;
  csubstr rem_1;
  size_t numnl_following;
  size_t first_non_whitespace;
  char curr_1;
  anon_class_40_5_c71bfa08 on_change_indentation;
  size_t i_1;
  bool is_indented;
  bool started;
  bool filtered_chars;
  size_t pos_1;
  char msg_5 [29];
  char msg_4 [42];
  bool changed;
  char msg_3 [29];
  char msg_2 [29];
  char msg_1 [34];
  char msg [32];
  size_t first;
  csubstr rem;
  char curr;
  size_t i;
  size_t pos;
  size_t numws;
  substr r;
  undefined4 in_stack_fffffffffffff460;
  undefined4 in_stack_fffffffffffff464;
  undefined4 in_stack_fffffffffffff468;
  undefined4 in_stack_fffffffffffff46c;
  undefined4 in_stack_fffffffffffff470;
  undefined4 in_stack_fffffffffffff474;
  char *in_stack_fffffffffffff478;
  Location *in_stack_fffffffffffff480;
  Location *this_00;
  basic_substring<char> *in_stack_fffffffffffff488;
  code *pcVar8;
  size_t in_stack_fffffffffffff490;
  undefined1 *puVar9;
  undefined1 *in_stack_fffffffffffff4c0;
  BlockChomp_e BVar10;
  code *in_stack_fffffffffffff4c8;
  undefined7 in_stack_fffffffffffff4d0;
  undefined1 in_stack_fffffffffffff4d7;
  substr *in_stack_fffffffffffff4d8;
  undefined7 in_stack_fffffffffffff4e0;
  undefined1 in_stack_fffffffffffff4e7;
  size_t in_stack_fffffffffffff508;
  char *pcVar11;
  Parser *in_stack_fffffffffffff510;
  char *in_stack_fffffffffffff578;
  Parser *in_stack_fffffffffffff580;
  char *in_stack_fffffffffffff588;
  code *in_stack_fffffffffffff590;
  bool local_969;
  basic_substring<char_const> local_968 [16];
  char *local_958;
  size_t local_950;
  substr local_948;
  undefined8 local_938;
  undefined8 local_930;
  undefined1 local_921;
  Location local_8f8;
  undefined4 uStack_8b8;
  undefined4 uStack_8b4;
  undefined4 local_8b0;
  undefined4 uStack_8ac;
  undefined4 uStack_8a8;
  undefined4 uStack_8a4;
  char *local_8a0;
  undefined1 local_898 [56];
  ulong local_860;
  ulong local_858;
  undefined4 uStack_848;
  undefined4 uStack_844;
  undefined4 local_840;
  undefined4 uStack_83c;
  undefined4 uStack_838;
  undefined4 uStack_834;
  char *local_830;
  undefined1 local_828 [64];
  undefined4 uStack_7e8;
  undefined4 uStack_7e4;
  undefined4 local_7e0;
  undefined4 uStack_7dc;
  undefined4 uStack_7d8;
  undefined4 uStack_7d4;
  char *local_7d0;
  undefined1 local_7c8 [56];
  ulong local_790;
  size_t local_788;
  undefined4 uStack_778;
  undefined4 uStack_774;
  undefined4 local_770;
  undefined4 uStack_76c;
  undefined4 uStack_768;
  undefined4 uStack_764;
  char *local_760;
  undefined1 local_758 [48];
  ulong local_728;
  undefined4 uStack_718;
  undefined4 uStack_714;
  undefined4 local_710;
  undefined4 uStack_70c;
  undefined4 uStack_708;
  undefined4 uStack_704;
  char *local_700;
  char local_6f8 [24];
  undefined4 in_stack_fffffffffffff920;
  undefined4 in_stack_fffffffffffff924;
  undefined8 in_stack_fffffffffffff928;
  undefined4 in_stack_fffffffffffff930;
  undefined4 in_stack_fffffffffffff934;
  undefined4 uStack_6c8;
  undefined4 uStack_6c4;
  undefined4 in_stack_fffffffffffff940;
  undefined4 in_stack_fffffffffffff944;
  undefined4 in_stack_fffffffffffff948;
  undefined4 in_stack_fffffffffffff94c;
  char *in_stack_fffffffffffff950;
  char local_6a8 [48];
  undefined4 uStack_678;
  undefined4 uStack_674;
  undefined4 local_670;
  undefined4 uStack_66c;
  undefined4 uStack_668;
  undefined4 uStack_664;
  char *local_660;
  char local_658 [48];
  undefined4 uStack_628;
  undefined4 uStack_624;
  undefined4 local_620;
  undefined4 uStack_61c;
  undefined4 uStack_618;
  undefined4 uStack_614;
  char *local_610;
  undefined1 local_608 [48];
  undefined4 uStack_5d8;
  undefined4 uStack_5d4;
  undefined4 local_5d0;
  undefined4 uStack_5cc;
  undefined4 uStack_5c8;
  undefined4 uStack_5c4;
  char *local_5c0;
  char local_5b8 [40];
  size_t local_590;
  undefined8 local_588;
  undefined8 local_580;
  ro_substr local_578;
  ulong local_568;
  ulong local_560;
  char local_551;
  anon_class_40_5_c71bfa08 local_550;
  size_t local_528;
  byte local_51b;
  byte local_51a;
  byte local_519;
  size_t local_518;
  char *local_510;
  ulong local_508;
  substr local_500;
  char local_4c8 [48];
  undefined4 uStack_498;
  undefined4 uStack_494;
  undefined4 local_490;
  undefined4 uStack_48c;
  undefined4 uStack_488;
  undefined4 uStack_484;
  char *local_480;
  char local_478 [48];
  undefined8 local_448;
  undefined8 local_440;
  byte local_431;
  undefined4 uStack_428;
  undefined4 uStack_424;
  undefined4 local_420;
  undefined4 uStack_41c;
  undefined4 uStack_418;
  undefined4 uStack_414;
  char *local_410;
  char local_408 [48];
  undefined4 uStack_3d8;
  undefined4 uStack_3d4;
  undefined4 local_3d0;
  undefined4 uStack_3cc;
  undefined4 uStack_3c8;
  undefined4 uStack_3c4;
  char *local_3c0;
  char local_3b8 [48];
  undefined4 uStack_388;
  undefined4 uStack_384;
  undefined4 local_380;
  undefined4 uStack_37c;
  undefined4 uStack_378;
  undefined4 uStack_374;
  char *local_370;
  undefined1 local_368 [48];
  undefined4 uStack_338;
  undefined4 uStack_334;
  undefined4 local_330;
  undefined4 uStack_32c;
  undefined4 uStack_328;
  undefined4 uStack_324;
  char *local_320;
  char local_318 [40];
  size_t local_2f0;
  undefined8 local_2e8;
  undefined8 local_2e0;
  ro_substr local_2d8;
  char local_2c1;
  ulong local_2c0;
  ulong local_2b8;
  undefined8 local_2b0;
  undefined8 local_2a8;
  undefined8 local_2a0;
  undefined8 local_298;
  char *local_290;
  ulong local_288;
  char *local_280;
  ulong local_278;
  size_t local_270;
  substr local_268;
  undefined8 local_258;
  undefined8 local_250;
  basic_substring<char_const> local_248 [16];
  basic_substring<char> local_238;
  ulong local_228;
  int local_220;
  int local_21c;
  char *local_210;
  size_t sStack_208;
  ro_substr local_200;
  char *local_1f0;
  undefined4 local_1e8;
  undefined8 local_1e0;
  substr *local_1d8;
  undefined8 local_1d0;
  undefined8 local_1c8;
  undefined8 local_1b0;
  substr *local_1a8;
  undefined8 local_1a0;
  undefined8 local_198;
  undefined8 local_180;
  char **local_178;
  undefined8 local_170;
  undefined8 local_168;
  char *local_160;
  undefined4 local_158;
  ulong local_150;
  substr *local_148;
  undefined8 local_140;
  undefined8 local_138;
  char *local_130;
  undefined4 local_128;
  ulong local_120;
  substr *local_118;
  undefined8 local_110;
  undefined8 local_108;
  char *local_100;
  undefined4 local_f8;
  size_t local_f0;
  substr *local_e8;
  char *local_e0;
  ulong local_d8;
  char *local_d0;
  undefined4 local_c8;
  ulong local_c0;
  substr *local_b8;
  char *local_b0;
  ulong local_a8;
  char *local_a0;
  undefined4 local_98;
  ulong local_90;
  substr *local_88;
  char *local_80;
  undefined4 local_78;
  ulong local_70;
  substr *local_68;
  char *local_60;
  undefined4 local_58;
  ulong local_50;
  substr *local_48;
  char *local_40;
  undefined4 local_38;
  ulong local_30;
  substr *local_28;
  char *local_20;
  undefined4 local_18;
  long local_10;
  substr *local_8;
  csubstr cVar6;
  csubstr cVar7;
  
  local_969 = false;
  local_228 = in_R9;
  local_220 = in_R8D;
  local_21c = in_ECX;
  local_210 = in_RSI;
  sStack_208 = in_RDX;
  if (in_R8D != 2) {
    basic_substring<char_const>::basic_substring<4ul>(local_248,(char (*) [4])" \n\r");
    rVar4.len = in_stack_fffffffffffff490;
    rVar4.str = (char *)in_stack_fffffffffffff488;
    local_238 = basic_substring<char>::trim
                          ((basic_substring<char> *)in_stack_fffffffffffff480,rVar4);
    local_969 = local_238.len == 0;
  }
  if (local_969) {
    local_178 = &local_210;
    local_180 = 0;
    basic_substring<char>::basic_substring
              ((basic_substring<char> *)in_stack_fffffffffffff480,in_stack_fffffffffffff478,
               CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470));
    local_258 = local_170;
    local_250 = local_168;
    local_200 = basic_substring::operator_cast_to_basic_substring((basic_substring<char> *)0x3c1ceb)
    ;
  }
  else {
    local_268.str = local_210;
    local_268.len = sStack_208;
    if (local_21c == 0) {
      local_270 = basic_substring<char>::first_not_of
                            (in_stack_fffffffffffff488,
                             (char)((ulong)in_stack_fffffffffffff480 >> 0x38),
                             (size_t)in_stack_fffffffffffff478);
      if (local_270 == 0xffffffffffffffff) {
        if ((local_220 == 2) && (local_268.len != 0)) {
          local_8 = &local_268;
          local_10 = 0;
          if (local_268.len == 0) {
            eVar2 = get_error_flags();
            if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
              trap_instruction();
            }
            local_20 = 
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
            ;
            local_18 = 0x14c3;
            handle_error(0x3f0daf,(char *)0x14c3,"check failed: %s","i >= 0 && i < len");
          }
          local_268.str[local_10] = '\n';
          local_1d8 = &local_268;
          local_1e0 = 1;
          if (local_268.len == 0) {
            eVar2 = get_error_flags();
            if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
              trap_instruction();
            }
            local_1f0 = 
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
            ;
            local_1e8 = 0x154e;
            handle_error(0x3f0daf,(char *)0x154e,"check failed: %s","num <= len || num == npos");
          }
          basic_substring<char>::basic_substring
                    ((basic_substring<char> *)in_stack_fffffffffffff480,in_stack_fffffffffffff478,
                     CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470));
          local_2b0 = local_1d0;
          local_2a8 = local_1c8;
          rVar4 = basic_substring::operator_cast_to_basic_substring
                            ((basic_substring<char> *)0x3c23bb);
          cVar6.str = rVar4.str;
          cVar6.len = rVar4.len;
          return cVar6;
        }
        local_1a8 = &local_268;
        local_1b0 = 0;
        basic_substring<char>::basic_substring
                  ((basic_substring<char> *)in_stack_fffffffffffff480,in_stack_fffffffffffff478,
                   CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470));
        local_2a0 = local_1a0;
        local_298 = local_198;
        rVar4 = basic_substring::operator_cast_to_basic_substring((basic_substring<char> *)0x3c2165)
        ;
        cVar7.str = rVar4.str;
        cVar7.len = rVar4.len;
        return cVar7;
      }
      if (local_228 < local_270) {
        local_b8 = &local_268;
        local_c0 = local_228;
        if (local_268.len < local_228) {
          eVar2 = get_error_flags();
          if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
            trap_instruction();
          }
          local_d0 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_c8 = 0x1533;
          handle_error(0x3f0daf,(char *)0x1533,"check failed: %s","first >= 0 && first <= len");
        }
        basic_substring<char>::basic_substring
                  ((basic_substring<char> *)in_stack_fffffffffffff480,in_stack_fffffffffffff478,
                   CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470));
        local_280 = local_b0;
        local_278 = local_a8;
        local_268.str = local_b0;
        local_268.len = local_a8;
      }
      else {
        local_e8 = &local_268;
        local_f0 = local_270;
        if (local_268.len < local_270) {
          eVar2 = get_error_flags();
          if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
            trap_instruction();
          }
          local_100 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_f8 = 0x1533;
          handle_error(0x3f0daf,(char *)0x1533,"check failed: %s","first >= 0 && first <= len");
        }
        basic_substring<char>::basic_substring
                  ((basic_substring<char> *)in_stack_fffffffffffff480,in_stack_fffffffffffff478,
                   CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470));
        local_290 = local_e0;
        local_288 = local_d8;
        local_268.str = local_e0;
        local_268.len = local_d8;
      }
      _grow_filter_arena(in_stack_fffffffffffff510,in_stack_fffffffffffff508);
      local_2b8 = 0;
      for (local_2c0 = 0; BVar10 = (BlockChomp_e)((ulong)in_stack_fffffffffffff4c0 >> 0x20),
          local_2c0 < local_268.len; local_2c0 = local_2c0 + 1) {
        local_2c1 = local_268.str[local_2c0];
        if (local_2c1 != '\r') {
          uVar3 = local_2b8 + 1;
          *(char *)(*(long *)(in_RDI + 0xa78) + local_2b8) = local_2c1;
          local_2b8 = uVar3;
          if (local_2c1 == '\n') {
            local_120 = local_2c0 + 1;
            local_118 = &local_268;
            if (local_268.len < local_120) {
              eVar2 = get_error_flags();
              if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
                trap_instruction();
              }
              local_130 = 
              "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
              ;
              local_128 = 0x1533;
              handle_error(0x3f0daf,(char *)0x1533,"check failed: %s","first >= 0 && first <= len");
            }
            basic_substring<char>::basic_substring
                      ((basic_substring<char> *)in_stack_fffffffffffff480,in_stack_fffffffffffff478,
                       CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470));
            local_2e8 = local_110;
            local_2e0 = local_108;
            local_2d8 = basic_substring::operator_cast_to_basic_substring
                                  ((basic_substring<char> *)0x3c25a1);
            local_2f0 = basic_substring<const_char>::first_not_of
                                  ((basic_substring<const_char> *)in_stack_fffffffffffff488,
                                   (char)((ulong)in_stack_fffffffffffff480 >> 0x38),
                                   (size_t)in_stack_fffffffffffff478);
            if (local_2f0 == 0xffffffffffffffff) {
              if (local_268.len < local_2c0 + 1) {
                builtin_strncpy(local_3b8,"check failed: (i+1 <= r.len)",0x1d);
                eVar2 = get_error_flags();
                if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
                  trap_instruction();
                }
                pcVar8 = *(code **)(in_RDI + 0x9e8);
                Location::Location(in_stack_fffffffffffff480,in_stack_fffffffffffff478,
                                   CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470),
                                   CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468),
                                   CONCAT44(in_stack_fffffffffffff464,in_stack_fffffffffffff460));
                in_stack_fffffffffffff460 = uStack_3d8;
                in_stack_fffffffffffff464 = uStack_3d4;
                in_stack_fffffffffffff468 = local_3d0;
                in_stack_fffffffffffff46c = uStack_3cc;
                in_stack_fffffffffffff470 = uStack_3c8;
                in_stack_fffffffffffff474 = uStack_3c4;
                in_stack_fffffffffffff478 = local_3c0;
                (*pcVar8)(local_3b8,0x1d,*(undefined8 *)(in_RDI + 0x9d0));
              }
              BVar10 = (BlockChomp_e)((ulong)in_stack_fffffffffffff4c0 >> 0x20);
              local_2f0 = local_2d8.len;
              if (local_2d8.len == 0) {
                if (local_2c0 + 1 == local_268.len) {
                  if (local_220 == 1) {
                    local_2b8 = local_2b8 - 1;
                  }
                  break;
                }
              }
              else {
                if (local_2d8.len < local_228) {
                  local_2b8 = local_2b8 - 1;
                  break;
                }
                local_2c0 = local_228 + local_2c0;
              }
            }
            else {
              if (local_2d8.len <= local_2f0) {
                builtin_strncpy(local_318,"check failed: (first < rem.len)",0x20);
                eVar2 = get_error_flags();
                if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
                  trap_instruction();
                }
                pcVar8 = *(code **)(in_RDI + 0x9e8);
                Location::Location(in_stack_fffffffffffff480,in_stack_fffffffffffff478,
                                   CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470),
                                   CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468),
                                   CONCAT44(in_stack_fffffffffffff464,in_stack_fffffffffffff460));
                in_stack_fffffffffffff460 = uStack_338;
                in_stack_fffffffffffff464 = uStack_334;
                in_stack_fffffffffffff468 = local_330;
                in_stack_fffffffffffff46c = uStack_32c;
                in_stack_fffffffffffff470 = uStack_328;
                in_stack_fffffffffffff474 = uStack_324;
                in_stack_fffffffffffff478 = local_320;
                (*pcVar8)(local_318,0x20,*(undefined8 *)(in_RDI + 0x9d0));
              }
              if (local_268.len <= local_2c0 + 1 + local_2f0) {
                memcpy(local_368,"check failed: (i+1+first < r.len)",0x22);
                eVar2 = get_error_flags();
                if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
                  trap_instruction();
                }
                pcVar8 = *(code **)(in_RDI + 0x9e8);
                Location::Location(in_stack_fffffffffffff480,in_stack_fffffffffffff478,
                                   CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470),
                                   CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468),
                                   CONCAT44(in_stack_fffffffffffff464,in_stack_fffffffffffff460));
                in_stack_fffffffffffff460 = uStack_388;
                in_stack_fffffffffffff464 = uStack_384;
                in_stack_fffffffffffff468 = local_380;
                in_stack_fffffffffffff46c = uStack_37c;
                in_stack_fffffffffffff470 = uStack_378;
                in_stack_fffffffffffff474 = uStack_374;
                in_stack_fffffffffffff478 = local_370;
                (*pcVar8)(local_368,0x22,*(undefined8 *)(in_RDI + 0x9d0));
              }
              uVar3 = local_228;
              if (local_2f0 < local_228) {
                uVar3 = local_2f0;
              }
              local_2c0 = uVar3 + local_2c0;
            }
          }
        }
      }
      if (sStack_208 < local_2b8) {
        builtin_strncpy(local_408,"check failed: (s.len >= pos)",0x1d);
        eVar2 = get_error_flags();
        if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
          trap_instruction();
        }
        pcVar8 = *(code **)(in_RDI + 0x9e8);
        Location::Location(in_stack_fffffffffffff480,in_stack_fffffffffffff478,
                           CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470),
                           CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468),
                           CONCAT44(in_stack_fffffffffffff464,in_stack_fffffffffffff460));
        (*pcVar8)(local_408,0x1d,*(undefined8 *)(in_RDI + 0x9d0));
        in_stack_fffffffffffff460 = uStack_428;
        in_stack_fffffffffffff464 = uStack_424;
        in_stack_fffffffffffff468 = local_420;
        in_stack_fffffffffffff46c = uStack_41c;
        in_stack_fffffffffffff470 = uStack_418;
        in_stack_fffffffffffff474 = uStack_414;
        in_stack_fffffffffffff478 = local_410;
      }
      local_448 = *(undefined8 *)(in_RDI + 0xa78);
      local_440 = *(undefined8 *)(in_RDI + 0xa80);
      buf.len._0_7_ = in_stack_fffffffffffff4e0;
      buf.str = (char *)in_stack_fffffffffffff4d8;
      buf.len._7_1_ = in_stack_fffffffffffff4e7;
      local_431 = _apply_chomp((Parser *)
                               CONCAT17(in_stack_fffffffffffff4d7,in_stack_fffffffffffff4d0),buf,
                               (size_t *)in_stack_fffffffffffff4c8,BVar10);
      if (*(ulong *)(in_RDI + 0xa80) < local_2b8) {
        memcpy(local_478,"check failed: (pos <= m_filter_arena.len)",0x2a);
        eVar2 = get_error_flags();
        if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
          trap_instruction();
        }
        in_stack_fffffffffffff590 = *(code **)(in_RDI + 0x9e8);
        in_stack_fffffffffffff588 = local_478;
        Location::Location(in_stack_fffffffffffff480,in_stack_fffffffffffff478,
                           CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470),
                           CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468),
                           CONCAT44(in_stack_fffffffffffff464,in_stack_fffffffffffff460));
        (*in_stack_fffffffffffff590)(in_stack_fffffffffffff588,0x2a,*(undefined8 *)(in_RDI + 0x9d0))
        ;
        in_stack_fffffffffffff460 = uStack_498;
        in_stack_fffffffffffff464 = uStack_494;
        in_stack_fffffffffffff468 = local_490;
        in_stack_fffffffffffff46c = uStack_48c;
        in_stack_fffffffffffff470 = uStack_488;
        in_stack_fffffffffffff474 = uStack_484;
        in_stack_fffffffffffff478 = local_480;
      }
      if (sStack_208 < local_2b8) {
        builtin_strncpy(local_4c8,"check failed: (pos <= s.len)",0x1d);
        eVar2 = get_error_flags();
        if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
          trap_instruction();
        }
        in_stack_fffffffffffff580 = *(Parser **)(in_RDI + 0x9e8);
        in_stack_fffffffffffff578 = local_4c8;
        Location::Location(in_stack_fffffffffffff480,in_stack_fffffffffffff478,
                           CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470),
                           CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468),
                           CONCAT44(in_stack_fffffffffffff464,in_stack_fffffffffffff460));
        (*(code *)in_stack_fffffffffffff580)
                  (in_stack_fffffffffffff578,0x1d,*(undefined8 *)(in_RDI + 0x9d0));
      }
      if ((local_2b8 < local_268.len) || ((local_431 & 1) != 0)) {
        local_510 = local_210;
        local_508 = sStack_208;
        dst.len = (size_t)in_stack_fffffffffffff590;
        dst.str = in_stack_fffffffffffff588;
        local_500 = _finish_filter_arena
                              (in_stack_fffffffffffff580,dst,(size_t)in_stack_fffffffffffff578);
        local_268.str = local_500.str;
        local_268.len = local_500.len;
      }
    }
    else if (local_21c == 1) {
      _grow_filter_arena(in_stack_fffffffffffff510,in_stack_fffffffffffff508);
      local_518 = 0;
      local_519 = 0;
      local_51a = 0;
      local_51b = 0;
      local_528 = basic_substring<char>::first_not_of
                            (in_stack_fffffffffffff488,
                             (char)((ulong)in_stack_fffffffffffff480 >> 0x38),
                             (size_t)in_stack_fffffffffffff478);
      if (local_228 < local_528) {
        local_51b = 1;
        local_528 = local_228;
      }
      local_550.pos = &local_518;
      local_550.i = &local_528;
      local_550.indentation = &local_228;
      local_550.r = &local_268;
      for (; BVar10 = (BlockChomp_e)((ulong)in_stack_fffffffffffff4c0 >> 0x20),
          local_528 < local_268.len; local_528 = local_528 + 1) {
        local_551 = local_268.str[local_528];
        if (local_551 == '\n') {
          local_519 = 1;
          local_568 = 0xffffffffffffffff;
LAB_003c2f15:
          local_28 = &local_268;
          local_30 = local_528;
          if (local_268.len <= local_528) {
            eVar2 = get_error_flags();
            if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
              trap_instruction();
            }
            local_40 = 
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
            ;
            local_38 = 0x14c3;
            handle_error(0x3f0daf,(char *)0x14c3,"check failed: %s","i >= 0 && i < len");
          }
          BVar10 = (BlockChomp_e)((ulong)in_stack_fffffffffffff4c0 >> 0x20);
          if (local_268.str[local_30] != '\n') {
LAB_003c39d9:
            for (local_728 = 0; local_728 < local_568 + 1; local_728 = local_728 + 1) {
              *(undefined1 *)(*(long *)(in_RDI + 0xa78) + local_518) = 10;
              local_518 = local_518 + 1;
            }
            break;
          }
          local_568 = local_568 + 1;
          local_150 = local_528 + 1;
          local_148 = &local_268;
          if (local_268.len < local_150) {
            eVar2 = get_error_flags();
            if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
              trap_instruction();
            }
            local_160 = 
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
            ;
            local_158 = 0x1533;
            handle_error(0x3f0daf,(char *)0x1533,"check failed: %s","first >= 0 && first <= len");
          }
          basic_substring<char>::basic_substring
                    ((basic_substring<char> *)in_stack_fffffffffffff480,in_stack_fffffffffffff478,
                     CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470));
          local_588 = local_140;
          local_580 = local_138;
          local_578 = basic_substring::operator_cast_to_basic_substring
                                ((basic_substring<char> *)0x3c3126);
          local_590 = basic_substring<const_char>::first_not_of
                                ((basic_substring<const_char> *)in_stack_fffffffffffff488,
                                 (char)((ulong)in_stack_fffffffffffff480 >> 0x38),
                                 (size_t)in_stack_fffffffffffff478);
          if (local_590 != 0xffffffffffffffff) {
            local_560 = local_590 + local_528;
            do {
              local_560 = local_560 + 1;
              bVar1 = false;
              if (local_560 < local_268.len) {
                local_48 = &local_268;
                local_50 = local_560;
                if (local_268.len <= local_560) {
                  eVar2 = get_error_flags();
                  if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
                    trap_instruction();
                  }
                  local_60 = 
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                  ;
                  local_58 = 0x14c3;
                  handle_error(0x3f0daf,(char *)0x14c3,"check failed: %s","i >= 0 && i < len");
                }
                bVar1 = local_268.str[local_50] == '\r';
              }
            } while (bVar1);
            if (local_578.len <= local_590) {
              builtin_strncpy(local_5b8,"check failed: (first < rem.len)",0x20);
              eVar2 = get_error_flags();
              if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
                trap_instruction();
              }
              pcVar8 = *(code **)(in_RDI + 0x9e8);
              Location::Location(in_stack_fffffffffffff480,in_stack_fffffffffffff478,
                                 CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470),
                                 CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468),
                                 CONCAT44(in_stack_fffffffffffff464,in_stack_fffffffffffff460));
              in_stack_fffffffffffff460 = uStack_5d8;
              in_stack_fffffffffffff464 = uStack_5d4;
              in_stack_fffffffffffff468 = local_5d0;
              in_stack_fffffffffffff46c = uStack_5cc;
              in_stack_fffffffffffff470 = uStack_5c8;
              in_stack_fffffffffffff474 = uStack_5c4;
              in_stack_fffffffffffff478 = local_5c0;
              (*pcVar8)(local_5b8,0x20,*(undefined8 *)(in_RDI + 0x9d0));
            }
            if (local_268.len <= local_528 + 1 + local_590) {
              memcpy(local_608,"check failed: (i+1+first < r.len)",0x22);
              eVar2 = get_error_flags();
              if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
                trap_instruction();
              }
              pcVar8 = *(code **)(in_RDI + 0x9e8);
              Location::Location(in_stack_fffffffffffff480,in_stack_fffffffffffff478,
                                 CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470),
                                 CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468),
                                 CONCAT44(in_stack_fffffffffffff464,in_stack_fffffffffffff460));
              in_stack_fffffffffffff460 = uStack_628;
              in_stack_fffffffffffff464 = uStack_624;
              in_stack_fffffffffffff468 = local_620;
              in_stack_fffffffffffff46c = uStack_61c;
              in_stack_fffffffffffff470 = uStack_618;
              in_stack_fffffffffffff474 = uStack_614;
              in_stack_fffffffffffff478 = local_610;
              (*pcVar8)(local_608,0x22,*(undefined8 *)(in_RDI + 0x9d0));
            }
            if (local_590 < local_228) {
              local_528 = local_590 + local_528;
            }
            else {
              local_528 = local_228 + local_528;
              if (local_228 < local_590) goto LAB_003c3a45;
            }
            local_68 = &local_268;
            local_70 = local_560;
            if (local_268.len <= local_560) {
              eVar2 = get_error_flags();
              if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
                trap_instruction();
              }
              local_80 = 
              "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
              ;
              local_78 = 0x14c3;
              handle_error(0x3f0daf,(char *)0x14c3,"check failed: %s","i >= 0 && i < len");
            }
            if (local_268.str[local_70] == '\n') goto code_r0x003c35dc;
            goto LAB_003c3a45;
          }
          if (local_268.len < local_528 + 1) {
            builtin_strncpy(local_658,"check failed: (i+1 <= r.len)",0x1d);
            eVar2 = get_error_flags();
            if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
              trap_instruction();
            }
            pcVar8 = *(code **)(in_RDI + 0x9e8);
            pcVar11 = local_658;
            Location::Location(in_stack_fffffffffffff480,in_stack_fffffffffffff478,
                               CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470),
                               CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468),
                               CONCAT44(in_stack_fffffffffffff464,in_stack_fffffffffffff460));
            in_stack_fffffffffffff460 = uStack_678;
            in_stack_fffffffffffff464 = uStack_674;
            in_stack_fffffffffffff468 = local_670;
            in_stack_fffffffffffff46c = uStack_66c;
            in_stack_fffffffffffff470 = uStack_668;
            in_stack_fffffffffffff474 = uStack_664;
            in_stack_fffffffffffff478 = local_660;
            (*pcVar8)(pcVar11,0x1d,*(undefined8 *)(in_RDI + 0x9d0));
          }
          BVar10 = (BlockChomp_e)((ulong)in_stack_fffffffffffff4c0 >> 0x20);
          local_590 = local_578.len;
          local_560 = local_578.len + local_528 + 1;
          if (local_578.len == 0) {
            if (local_528 + 1 != local_268.len) {
              builtin_strncpy(local_6a8,"check failed: (i+1 == r.len)",0x1d);
              eVar2 = get_error_flags();
              if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
                trap_instruction();
              }
              pcVar8 = *(code **)(in_RDI + 0x9e8);
              b = CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470);
              l = CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468);
              in_stack_fffffffffffff468 = in_stack_fffffffffffff940;
              in_stack_fffffffffffff46c = in_stack_fffffffffffff944;
              in_stack_fffffffffffff470 = in_stack_fffffffffffff948;
              in_stack_fffffffffffff474 = in_stack_fffffffffffff94c;
              Location::Location(in_stack_fffffffffffff480,in_stack_fffffffffffff478,b,l,
                                 CONCAT44(in_stack_fffffffffffff464,in_stack_fffffffffffff460));
              in_stack_fffffffffffff478 = in_stack_fffffffffffff950;
              (*pcVar8)(local_6a8,0x1d,*(undefined8 *)(in_RDI + 0x9d0));
              in_stack_fffffffffffff460 = uStack_6c8;
              in_stack_fffffffffffff464 = uStack_6c4;
            }
            if (local_578.len != 0) {
              builtin_strncpy(local_6f8,"check failed: (rem.len =",0x18);
              eVar2 = get_error_flags();
              if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
                trap_instruction();
              }
              pcVar8 = *(code **)(in_RDI + 0x9e8);
              Location::Location(in_stack_fffffffffffff480,in_stack_fffffffffffff478,
                                 CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470),
                                 CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468),
                                 CONCAT44(in_stack_fffffffffffff464,in_stack_fffffffffffff460));
              (*pcVar8)(local_6f8,0x1d,*(undefined8 *)(in_RDI + 0x9d0));
              in_stack_fffffffffffff460 = uStack_718;
              in_stack_fffffffffffff464 = uStack_714;
              in_stack_fffffffffffff468 = local_710;
              in_stack_fffffffffffff46c = uStack_70c;
              in_stack_fffffffffffff470 = uStack_708;
              in_stack_fffffffffffff474 = uStack_704;
              in_stack_fffffffffffff478 = local_700;
            }
            goto LAB_003c39d9;
          }
          if (local_578.len < local_228) {
            local_528 = local_578.len + local_528;
            goto LAB_003c39d9;
          }
          local_528 = local_228 + local_528;
          if (local_578.len <= local_228) goto LAB_003c39d9;
LAB_003c3a45:
          while( true ) {
            in_stack_fffffffffffff4e7 = false;
            if (local_560 < local_268.len) {
              in_stack_fffffffffffff4d8 = &local_268;
              local_90 = local_560;
              local_88 = in_stack_fffffffffffff4d8;
              if (local_268.len <= local_560) {
                eVar2 = get_error_flags();
                if (((eVar2 & 1) != 0) &&
                   (in_stack_fffffffffffff4d7 = is_debugger_attached(),
                   (bool)in_stack_fffffffffffff4d7)) {
                  trap_instruction();
                }
                local_a0 = 
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                ;
                local_98 = 0x14c3;
                handle_error(0x3f0daf,(char *)0x14c3,"check failed: %s","i >= 0 && i < len");
              }
              in_stack_fffffffffffff4e7 = in_stack_fffffffffffff4d8->str[local_90] == '\t';
            }
            if ((bool)in_stack_fffffffffffff4e7 == false) break;
            local_560 = local_560 + 1;
          }
          if (local_268.len < local_560) {
            memcpy(local_758,"check failed: (first_non_whitespace <= r.len)",0x2e);
            eVar2 = get_error_flags();
            if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
              trap_instruction();
            }
            in_stack_fffffffffffff4c8 = *(code **)(in_RDI + 0x9e8);
            in_stack_fffffffffffff4c0 = local_758;
            Location::Location(in_stack_fffffffffffff480,in_stack_fffffffffffff478,
                               CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470),
                               CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468),
                               CONCAT44(in_stack_fffffffffffff464,in_stack_fffffffffffff460));
            in_stack_fffffffffffff460 = uStack_778;
            in_stack_fffffffffffff464 = uStack_774;
            in_stack_fffffffffffff468 = local_770;
            in_stack_fffffffffffff46c = uStack_76c;
            in_stack_fffffffffffff470 = uStack_768;
            in_stack_fffffffffffff474 = uStack_764;
            in_stack_fffffffffffff478 = local_760;
            (*in_stack_fffffffffffff4c8)
                      (in_stack_fffffffffffff4c0,0x2e,*(undefined8 *)(in_RDI + 0x9d0));
          }
          local_788 = basic_substring<char>::last_of
                                (in_stack_fffffffffffff488,
                                 (char)((ulong)in_stack_fffffffffffff480 >> 0x38),
                                 (size_t)in_stack_fffffffffffff478);
          local_790 = (local_560 - local_788) - 1;
          if (local_560 < local_788 + 1) {
            memcpy(local_7c8,"check failed: (first_non_whitespace >= last_newl + 1)",0x36);
            eVar2 = get_error_flags();
            if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
              trap_instruction();
            }
            pcVar8 = *(code **)(in_RDI + 0x9e8);
            Location::Location(in_stack_fffffffffffff480,in_stack_fffffffffffff478,
                               CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470),
                               CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468),
                               CONCAT44(in_stack_fffffffffffff464,in_stack_fffffffffffff460));
            in_stack_fffffffffffff460 = uStack_7e8;
            in_stack_fffffffffffff464 = uStack_7e4;
            in_stack_fffffffffffff468 = local_7e0;
            in_stack_fffffffffffff46c = uStack_7dc;
            in_stack_fffffffffffff470 = uStack_7d8;
            in_stack_fffffffffffff474 = uStack_7d4;
            in_stack_fffffffffffff478 = local_7d0;
            (*pcVar8)(local_7c8,0x36,*(undefined8 *)(in_RDI + 0x9d0));
          }
          if (local_790 < local_228) {
            memcpy(local_828,"check failed: (this_indentation >= indentation)",0x30);
            eVar2 = get_error_flags();
            if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
              trap_instruction();
            }
            pcVar8 = *(code **)(in_RDI + 0x9e8);
            Location::Location(in_stack_fffffffffffff480,in_stack_fffffffffffff478,
                               CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470),
                               CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468),
                               CONCAT44(in_stack_fffffffffffff464,in_stack_fffffffffffff460));
            in_stack_fffffffffffff460 = uStack_848;
            in_stack_fffffffffffff464 = uStack_844;
            in_stack_fffffffffffff468 = local_840;
            in_stack_fffffffffffff46c = uStack_83c;
            in_stack_fffffffffffff470 = uStack_838;
            in_stack_fffffffffffff474 = uStack_834;
            in_stack_fffffffffffff478 = local_830;
            (*pcVar8)(local_828,0x30,*(undefined8 *)(in_RDI + 0x9d0));
          }
          if ((local_51a & 1) == 0) {
            for (local_858 = 0; local_858 < local_568 + 1; local_858 = local_858 + 1) {
              *(undefined1 *)(*(long *)(in_RDI + 0xa78) + local_518) = 10;
              local_518 = local_518 + 1;
            }
            if (local_228 < local_790) {
              local_51b = 1;
              local_528 = local_788 + local_228;
            }
            else {
              local_528 = local_560 - 1;
            }
          }
          else if (local_790 == local_228) {
            if ((local_51b & 1) == 0) {
              if (local_568 == 0) {
                *(undefined1 *)(*(long *)(in_RDI + 0xa78) + local_518) = 0x20;
                local_518 = local_518 + 1;
              }
              else {
                for (local_860 = 0; local_860 < local_568; local_860 = local_860 + 1) {
                  *(undefined1 *)(*(long *)(in_RDI + 0xa78) + local_518) = 10;
                  local_518 = local_518 + 1;
                }
              }
              local_528 = local_560 - 1;
            }
            else {
              local_51b = 0;
              _filter_block_scalar::anon_class_40_5_c71bfa08::operator()
                        (&local_550,local_568,local_788,local_560);
            }
          }
          else {
            local_51b = 1;
            if (local_790 <= local_228) {
              memcpy(local_898,"check failed: (this_indentation > indentation)",0x2f);
              eVar2 = get_error_flags();
              if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
                trap_instruction();
              }
              pcVar8 = *(code **)(in_RDI + 0x9e8);
              puVar9 = local_898;
              Location::Location(in_stack_fffffffffffff480,in_stack_fffffffffffff478,
                                 CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470),
                                 CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468),
                                 CONCAT44(in_stack_fffffffffffff464,in_stack_fffffffffffff460));
              in_stack_fffffffffffff460 = uStack_8b8;
              in_stack_fffffffffffff464 = uStack_8b4;
              in_stack_fffffffffffff468 = local_8b0;
              in_stack_fffffffffffff46c = uStack_8ac;
              in_stack_fffffffffffff470 = uStack_8a8;
              in_stack_fffffffffffff474 = uStack_8a4;
              in_stack_fffffffffffff478 = local_8a0;
              (*pcVar8)(puVar9,0x2f,*(undefined8 *)(in_RDI + 0x9d0));
            }
            _filter_block_scalar::anon_class_40_5_c71bfa08::operator()
                      (&local_550,local_568,local_788,local_560);
          }
        }
        else if (local_551 != '\r') {
          if (local_551 != '\t') {
            local_51a = 1;
          }
          *(char *)(*(long *)(in_RDI + 0xa78) + local_518) = local_551;
          local_518 = local_518 + 1;
        }
      }
      if (*(ulong *)(in_RDI + 0xa80) < local_518) {
        memcpy(&local_8f8,"check failed: (pos <= m_filter_arena.len)",0x2a);
        eVar2 = get_error_flags();
        if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
          trap_instruction();
        }
        pcVar8 = *(code **)(in_RDI + 0x9e8);
        this_00 = &local_8f8;
        Location::Location(this_00,in_stack_fffffffffffff478,
                           CONCAT44(in_stack_fffffffffffff474,in_stack_fffffffffffff470),
                           CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468),
                           CONCAT44(in_stack_fffffffffffff464,in_stack_fffffffffffff460));
        (*pcVar8)(this_00,0x2a,*(undefined8 *)(in_RDI + 0x9d0));
      }
      local_938 = *(undefined8 *)(in_RDI + 0xa78);
      local_930 = *(undefined8 *)(in_RDI + 0xa80);
      buf_00.len._0_7_ = in_stack_fffffffffffff4e0;
      buf_00.str = (char *)in_stack_fffffffffffff4d8;
      buf_00.len._7_1_ = in_stack_fffffffffffff4e7;
      local_921 = _apply_chomp((Parser *)
                               CONCAT17(in_stack_fffffffffffff4d7,in_stack_fffffffffffff4d0),buf_00,
                               (size_t *)in_stack_fffffffffffff4c8,BVar10);
      if (((local_518 < local_268.len) || ((local_519 & 1) != 0)) || ((bool)local_921)) {
        local_958 = local_210;
        local_950 = sStack_208;
        dst_00.len = (size_t)in_stack_fffffffffffff590;
        dst_00.str = in_stack_fffffffffffff588;
        local_948 = _finish_filter_arena
                              (in_stack_fffffffffffff580,dst_00,(size_t)in_stack_fffffffffffff578);
        local_268.str = local_948.str;
        local_268.len = local_948.len;
      }
    }
    else {
      bVar1 = is_debugger_attached();
      if ((bVar1) && (bVar1 = is_debugger_attached(), bVar1)) {
        trap_instruction();
      }
      basic_substring<char_const>::basic_substring<27ul>
                (local_968,(char (*) [27])"ERROR: unknown block style");
      fmt.len._0_4_ = in_stack_fffffffffffff930;
      fmt.str = (char *)in_stack_fffffffffffff928;
      fmt.len._4_4_ = in_stack_fffffffffffff934;
      _err<>((Parser *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),fmt);
    }
    local_200 = basic_substring::operator_cast_to_basic_substring((basic_substring<char> *)0x3c43a5)
    ;
  }
  cVar5.str = local_200.str;
  cVar5.len = local_200.len;
  return cVar5;
code_r0x003c35dc:
  local_528 = local_560;
  goto LAB_003c2f15;
}

Assistant:

csubstr Parser::_filter_block_scalar(substr s, BlockStyle_e style, BlockChomp_e chomp, size_t indentation)
{
    // a debugging scaffold:
    #if 0
    #define _c4dbgfbl(fmt, ...) _c4dbgpf("filt_block" fmt, __VA_ARGS__)
    #else
    #define _c4dbgfbl(...)
    #endif

    _c4dbgfbl(": indentation={} before=[{}]~~~{}~~~", indentation, s.len, s);

    if(chomp != CHOMP_KEEP && s.trim(" \n\r").len == 0u)
    {
        _c4dbgp("filt_block: empty scalar");
        return s.first(0);
    }

    substr r = s;

    switch(style)
    {
    case BLOCK_LITERAL:
        {
            _c4dbgp("filt_block: style=literal");
            // trim leading whitespace up to indentation
            {
                size_t numws = r.first_not_of(' ');
                if(numws != npos)
                {
                    if(numws > indentation)
                        r = r.sub(indentation);
                    else
                        r = r.sub(numws);
                    _c4dbgfbl(": after triml=[{}]~~~{}~~~", r.len, r);
                }
                else
                {
                    if(chomp != CHOMP_KEEP || r.len == 0)
                    {
                        _c4dbgfbl(": all spaces {}, return empty", r.len);
                        return r.first(0);
                    }
                    else
                    {
                        r[0] = '\n';
                        return r.first(1);
                    }
                }
            }
            _grow_filter_arena(s.len + 2u);  // use s.len! because we may need to add a newline at the end, so the leading indentation will allow space for that newline
            size_t pos = 0; // the filtered size
            for(size_t i = 0; i < r.len; ++i)
            {
                const char curr = r.str[i];
                _c4dbgfbl("[{}]='{}'  pos={}", i, _c4prc(curr), pos);
                if(curr == '\r')
                    continue;
                m_filter_arena.str[pos++] = curr;
                if(curr == '\n')
                {
                    _c4dbgfbl("[{}]: found newline", i);
                    // skip indentation on the next line
                    csubstr rem = r.sub(i+1);
                    size_t first = rem.first_not_of(' ');
                    if(first != npos)
                    {
                        _RYML_CB_ASSERT(m_stack.m_callbacks, first < rem.len);
                        _RYML_CB_ASSERT(m_stack.m_callbacks, i+1+first < r.len);
                        _c4dbgfbl("[{}]: {} spaces follow before next nonws character @ [{}]='{}'", i, first, i+1+first, rem.str[first]);
                        if(first < indentation)
                        {
                            _c4dbgfbl("[{}]: skip {}<{} spaces from indentation", i, first, indentation);
                            i += first;
                        }
                        else
                        {
                            _c4dbgfbl("[{}]: skip {} spaces from indentation", i, indentation);
                            i += indentation;
                        }
                    }
                    else
                    {
                        _RYML_CB_ASSERT(m_stack.m_callbacks, i+1 <= r.len);
                        first = rem.len;
                        _c4dbgfbl("[{}]: {} spaces to the end", i, first);
                        if(first)
                        {
                            if(first < indentation)
                            {
                                _c4dbgfbl("[{}]: skip everything", i);
                                --pos;
                                break;
                            }
                            else
                            {
                                _c4dbgfbl("[{}]: skip {} spaces from indentation", i, indentation);
                                i += indentation;
                            }
                        }
                        else if(i+1 == r.len)
                        {
                            if(chomp == CHOMP_STRIP)
                                --pos;
                            break;
                        }
                    }
                }
            }
            _RYML_CB_ASSERT(m_stack.m_callbacks, s.len >= pos);
            _c4dbgfbl(": #filteredchars={} after=~~~{}~~~", s.len - r.len, r);
            bool changed = _apply_chomp(m_filter_arena, &pos, chomp);
            _RYML_CB_ASSERT(m_stack.m_callbacks, pos <= m_filter_arena.len);
            _RYML_CB_ASSERT(m_stack.m_callbacks, pos <= s.len);
            if(pos < r.len || changed)
            {
                r = _finish_filter_arena(s, pos); // write into s
            }
            break;
        }
    case BLOCK_FOLD:
        {
            _c4dbgp("filt_block: style=fold");
            _grow_filter_arena(r.len + 2);
            size_t pos = 0; // the filtered size
            bool filtered_chars = false;
            bool started = false;
            bool is_indented = false;
            size_t i = r.first_not_of(' ');
            _c4dbgfbl(": first non space at {}", i);
            if(i > indentation)
            {
                is_indented = true;
                i = indentation;
            }
            _c4dbgfbl(": start folding at {}, is_indented={}", i, (int)is_indented);
            auto on_change_indentation = [&](size_t numnl_following, size_t last_newl, size_t first_non_whitespace){
                _c4dbgfbl("[{}]: add 1+{} newlines", i, numnl_following);
                for(size_t j = 0; j < 1 + numnl_following; ++j)
                    m_filter_arena.str[pos++] = '\n';
                for(i = last_newl + 1 + indentation; i < first_non_whitespace; ++i)
                {
                    if(r.str[i] == '\r')
                        continue;
                    _c4dbgfbl("[{}]: add '{}'", i, _c4prc(r.str[i]));
                    m_filter_arena.str[pos++] = r.str[i];
                }
                --i;
            };
            for( ; i < r.len; ++i)
            {
                const char curr = r.str[i];
                _c4dbgfbl("[{}]='{}'", i, _c4prc(curr));
                if(curr == '\n')
                {
                    filtered_chars = true;
                    // skip indentation on the next line, and advance over the next non-indented blank lines as well
                    size_t first_non_whitespace;
                    size_t numnl_following = (size_t)-1;
                    while(r[i] == '\n')
                    {
                        ++numnl_following;
                        csubstr rem = r.sub(i+1);
                        size_t first = rem.first_not_of(' ');
                        _c4dbgfbl("[{}]: found newline. first={} rem.len={}", i, first, rem.len);
                        if(first != npos)
                        {
                            first_non_whitespace = first + i+1;
                            while(first_non_whitespace < r.len && r[first_non_whitespace] == '\r')
                                ++first_non_whitespace;
                            _RYML_CB_ASSERT(m_stack.m_callbacks, first < rem.len);
                            _RYML_CB_ASSERT(m_stack.m_callbacks, i+1+first < r.len);
                            _c4dbgfbl("[{}]: {} spaces follow before next nonws character @ [{}]='{}'", i, first, i+1+first, _c4prc(rem.str[first]));
                            if(first < indentation)
                            {
                                _c4dbgfbl("[{}]: skip {}<{} spaces from indentation", i, first, indentation);
                                i += first;
                            }
                            else
                            {
                                _c4dbgfbl("[{}]: skip {} spaces from indentation", i, indentation);
                                i += indentation;
                                if(first > indentation)
                                {
                                    _c4dbgfbl("[{}]: {} further indented than {}, stop newlining", i, first, indentation);
                                    goto finished_counting_newlines;
                                }
                            }
                            // prepare the next while loop iteration
                            // by setting i at the next newline after
                            // an empty line
                            if(r[first_non_whitespace] == '\n')
                                i = first_non_whitespace;
                            else
                                goto finished_counting_newlines;
                        }
                        else
                        {
                            _RYML_CB_ASSERT(m_stack.m_callbacks, i+1 <= r.len);
                            first = rem.len;
                            first_non_whitespace = first + i+1;
                            if(first)
                            {
                                _c4dbgfbl("[{}]: {} spaces to the end", i, first);
                                if(first < indentation)
                                {
                                    _c4dbgfbl("[{}]: skip everything", i);
                                    i += first;
                                }
                                else
                                {
                                    _c4dbgfbl("[{}]: skip {} spaces from indentation", i, indentation);
                                    i += indentation;
                                    if(first > indentation)
                                    {
                                        _c4dbgfbl("[{}]: {} spaces missing. not done yet", i, indentation - first);
                                        goto finished_counting_newlines;
                                    }
                                }
                            }
                            else // if(i+1 == r.len)
                            {
                                _c4dbgfbl("[{}]: it's the final newline", i);
                                _RYML_CB_ASSERT(m_stack.m_callbacks, i+1 == r.len);
                                _RYML_CB_ASSERT(m_stack.m_callbacks, rem.len == 0);
                            }
                            goto end_of_scalar;
                        }
                    }
                end_of_scalar:
                    // Write all the trailing newlines. Since we're
                    // at the end no folding is needed, so write every
                    // newline (add 1).
                    _c4dbgfbl("[{}]: add {} trailing newlines", i, 1+numnl_following);
                    for(size_t j = 0; j < 1 + numnl_following; ++j)
                        m_filter_arena.str[pos++] = '\n';
                    break;
                finished_counting_newlines:
                    _c4dbgfbl("[{}]: #newlines={} firstnonws={}", i, numnl_following, first_non_whitespace);
                    while(first_non_whitespace < r.len && r[first_non_whitespace] == '\t')
                        ++first_non_whitespace;
                    _c4dbgfbl("[{}]: #newlines={} firstnonws={}", i, numnl_following, first_non_whitespace);
                    _RYML_CB_ASSERT(m_stack.m_callbacks, first_non_whitespace <= r.len);
                    size_t last_newl = r.last_of('\n', first_non_whitespace);
                    size_t this_indentation = first_non_whitespace - last_newl - 1;
                    _c4dbgfbl("[{}]: #newlines={} firstnonws={} lastnewl={} this_indentation={} vs indentation={}", i, numnl_following, first_non_whitespace, last_newl, this_indentation, indentation);
                    _RYML_CB_ASSERT(m_stack.m_callbacks, first_non_whitespace >= last_newl + 1);
                    _RYML_CB_ASSERT(m_stack.m_callbacks, this_indentation >= indentation);
                    if(!started)
                    {
                        _c4dbgfbl("[{}]: #newlines={}. write all leading newlines", i, numnl_following);
                        for(size_t j = 0; j < 1 + numnl_following; ++j)
                            m_filter_arena.str[pos++] = '\n';
                        if(this_indentation > indentation)
                        {
                            is_indented = true;
                            _c4dbgfbl("[{}]: advance ->{}", i, last_newl + indentation);
                            i = last_newl + indentation;
                        }
                        else
                        {
                            i = first_non_whitespace - 1;
                            _c4dbgfbl("[{}]: advance ->{}", i, first_non_whitespace);
                        }
                    }
                    else if(this_indentation == indentation)
                    {
                        _c4dbgfbl("[{}]: same indentation", i);
                        if(!is_indented)
                        {
                            if(numnl_following == 0)
                            {
                                _c4dbgfbl("[{}]: fold!", i);
                                m_filter_arena.str[pos++] = ' ';
                            }
                            else
                            {
                                _c4dbgfbl("[{}]: add {} newlines", i, 1 + numnl_following);
                                for(size_t j = 0; j < numnl_following; ++j)
                                    m_filter_arena.str[pos++] = '\n';
                            }
                            i = first_non_whitespace - 1;
                            _c4dbgfbl("[{}]: advance {}->{}", i, i, first_non_whitespace);
                        }
                        else
                        {
                            _c4dbgfbl("[{}]: back to ref indentation", i);
                            is_indented = false;
                            on_change_indentation(numnl_following, last_newl, first_non_whitespace);
                            _c4dbgfbl("[{}]: advance {}->{}", i, i, first_non_whitespace);
                        }
                    }
                    else
                    {
                        _c4dbgfbl("[{}]: increased indentation.", i);
                        is_indented = true;
                        _RYML_CB_ASSERT(m_stack.m_callbacks, this_indentation > indentation);
                        on_change_indentation(numnl_following, last_newl, first_non_whitespace);
                        _c4dbgfbl("[{}]: advance {}->{}", i, i, first_non_whitespace);
                    }
                }
                else if(curr != '\r')
                {
                    if(curr != '\t')
                        started = true;
                    m_filter_arena.str[pos++] = curr;
                }
            }
            _RYML_CB_ASSERT(m_stack.m_callbacks, pos <= m_filter_arena.len);
            _c4dbgfbl(": #filteredchars={} after=[{}]~~~{}~~~", (int)s.len - (int)pos, pos, m_filter_arena.first(pos));
            bool changed = _apply_chomp(m_filter_arena, &pos, chomp);
            if(pos < r.len || filtered_chars || changed)
            {
                r = _finish_filter_arena(s, pos); // write into s
            }
        }
        break;
    default:
        _c4err("unknown block style");
    }

    _c4dbgfbl(": final=[{}]~~~{}~~~", r.len, r);

    #undef _c4dbgfbl

    return r;
}